

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_vec2 nk_window_get_content_region_max(nk_context *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  nk_panel *pnVar5;
  nk_vec2 nVar6;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4014,"struct nk_vec2 nk_window_get_content_region_max(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    pnVar5 = ctx->current->layout;
    if (pnVar5 != (nk_panel *)0x0) {
      uVar1 = (pnVar5->clip).x;
      uVar3 = (pnVar5->clip).y;
      uVar2 = (pnVar5->clip).w;
      uVar4 = (pnVar5->clip).h;
      nVar6.x = (float)uVar2 + (float)uVar1;
      nVar6.y = (float)uVar4 + (float)uVar3;
      return nVar6;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4016,"struct nk_vec2 nk_window_get_content_region_max(struct nk_context *)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x4015,"struct nk_vec2 nk_window_get_content_region_max(struct nk_context *)");
}

Assistant:

NK_API struct nk_vec2
nk_window_get_content_region_max(struct nk_context *ctx)
{
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current) return nk_vec2(0,0);
    return nk_vec2(ctx->current->layout->clip.x + ctx->current->layout->clip.w,
        ctx->current->layout->clip.y + ctx->current->layout->clip.h);
}